

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionalUnlabeledTracker.h
# Opt level: O0

void TCLAP::OptionalUnlabeledTracker::check(bool req,string *argName)

{
  bool *pbVar1;
  SpecificationException *this;
  allocator local_39;
  string local_38;
  string *local_18;
  string *argName_local;
  bool req_local;
  
  local_18 = argName;
  argName_local._7_1_ = req;
  pbVar1 = alreadyOptional();
  if ((*pbVar1 & 1U) != 0) {
    this = (SpecificationException *)__cxa_allocate_exception(0x68);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,
               "You can\'t specify ANY Unlabeled Arg following an optional Unlabeled Arg",&local_39)
    ;
    SpecificationException::SpecificationException(this,&local_38,local_18);
    __cxa_throw(this,&SpecificationException::typeinfo,
                SpecificationException::~SpecificationException);
  }
  if ((argName_local._7_1_ & 1) == 0) {
    gotOptional();
  }
  return;
}

Assistant:

inline void OptionalUnlabeledTracker::check( bool req, const std::string& argName )
{
    if ( OptionalUnlabeledTracker::alreadyOptional() )
        throw( SpecificationException(
	"You can't specify ANY Unlabeled Arg following an optional Unlabeled Arg",
	                argName ) );

    if ( !req )
        OptionalUnlabeledTracker::gotOptional();
}